

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O1

double gam1(double *a)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar1 = *a;
  dVar4 = dVar1 + -0.5;
  dVar2 = (double)(~-(ulong)(0.0 < dVar4) & (ulong)dVar1 |
                  (ulong)(dVar4 + -0.5) & -(ulong)(0.0 < dVar4));
  if (0.0 <= dVar2) {
    if ((dVar2 == 0.0) && (!NAN(dVar2))) {
      return 0.0;
    }
    dVar3 = ((((((dVar2 * 0.000589597428611429 + -0.00514889771323592) * dVar2 + 0.0076696818164949)
                * dVar2 + 0.0597275330452234) * dVar2 + -0.230975380857675) * dVar2 +
             -0.409078193005776) * dVar2 + 0.577215664901533) /
            ((((dVar2 * 0.00423244297896961 + 0.0261132021441447) * dVar2 + 0.158451672430138) *
              dVar2 + 0.427569613095214) * dVar2 + 1.0);
    if (0.0 < dVar4) {
      return (dVar3 + -0.5 + -0.5) * (dVar2 / dVar1);
    }
  }
  else {
    dVar3 = ((((((((dVar2 * -0.000132674909766242 + 0.000266505979058923) * dVar2 +
                  0.00223047661158249) * dVar2 + -0.0118290993445146) * dVar2 + 0.000930357293360349
                ) * dVar2 + 0.118378989872749) * dVar2 + -0.244757765222226) * dVar2 +
             -0.771330383816272) * dVar2 + -0.422784335098468) /
            ((dVar2 * 0.0559398236957378 + 0.273076135303957) * dVar2 + 1.0);
    if (0.0 < dVar4) {
      return (dVar3 * dVar2) / dVar1;
    }
    dVar3 = dVar3 + 0.5 + 0.5;
  }
  return dVar3 * dVar1;
}

Assistant:

double gam1(double *a)
/*
     ------------------------------------------------------------------
     COMPUTATION OF 1/GAMMA(A+1) - 1  FOR -0.5 .LE. A .LE. 1.5
     ------------------------------------------------------------------
*/
{
static double s1 = .273076135303957e+00;
static double s2 = .559398236957378e-01;
static double p[7] = {
    .577215664901533e+00,-.409078193005776e+00,-.230975380857675e+00,
    .597275330452234e-01,.766968181649490e-02,-.514889771323592e-02,
    .589597428611429e-03
};
static double q[5] = {
    .100000000000000e+01,.427569613095214e+00,.158451672430138e+00,
    .261132021441447e-01,.423244297896961e-02
};
static double r[9] = {
    -.422784335098468e+00,-.771330383816272e+00,-.244757765222226e+00,
    .118378989872749e+00,.930357293360349e-03,-.118290993445146e-01,
    .223047661158249e-02,.266505979058923e-03,-.132674909766242e-03
};
static double gam1,bot,d,t,top,w,T1;
/*
     ..
     .. Executable Statements ..
*/
    t = *a;
    d = *a-0.5e0;
    if(d > 0.0e0) t = d-0.5e0;
    T1 = t;
    if(T1 < 0) goto S40;
    else if(T1 == 0) goto S10;
    else  goto S20;
S10:
    gam1 = 0.0e0;
    return gam1;
S20:
    top = (((((p[6]*t+p[5])*t+p[4])*t+p[3])*t+p[2])*t+p[1])*t+p[0];
    bot = (((q[4]*t+q[3])*t+q[2])*t+q[1])*t+1.0e0;
    w = top/bot;
    if(d > 0.0e0) goto S30;
    gam1 = *a*w;
    return gam1;
S30:
    gam1 = t/ *a*(w-0.5e0-0.5e0);
    return gam1;
S40:
    top = (((((((r[8]*t+r[7])*t+r[6])*t+r[5])*t+r[4])*t+r[3])*t+r[2])*t+r[1])*t+
      r[0];
    bot = (s2*t+s1)*t+1.0e0;
    w = top/bot;
    if(d > 0.0e0) goto S50;
    gam1 = *a*(w+0.5e0+0.5e0);
    return gam1;
S50:
    gam1 = t*w/ *a;
    return gam1;
}